

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.cpp
# Opt level: O3

void phyr::workerThreadFunc(int tIndex,shared_ptr<phyr::Barrier> *barrier)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  _Alloc_hider __stat_loc;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_60;
  string local_50;
  
  formatString<char_const*,int,int>
            (&local_50,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Started execution in worker thread %d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/concurrency.cpp"
             ,0x4d,tIndex);
  __stat_loc._M_p = local_50._M_dataplus._M_p;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  *(int *)(in_FS_OFFSET + -0x13a8) = tIndex;
  Barrier::wait((barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                __stat_loc._M_p);
  this = (barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (barrier->super___shared_ptr<phyr::Barrier,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  local_60._M_device = (mutex_type *)workListMutex;
  local_60._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  if (shutdownThreads == '\0') {
    do {
      lVar2 = workList;
      if ((_ZN4phyrL17reportWorkerStatsE_0 & 1) == 0) {
        if (workList == 0) goto LAB_0012974e;
        pcVar1 = *(char **)(workList + 0x40);
        pcVar5 = *(char **)(workList + 0x50);
        pcVar6 = pcVar5 + *(int *)(workList + 0x48);
        pcVar7 = pcVar6;
        if ((long)pcVar1 < (long)pcVar6) {
          pcVar7 = pcVar1;
        }
        *(char **)(workList + 0x50) = pcVar7;
        if ((long)pcVar1 <= (long)pcVar6) {
          workList = *(long *)(lVar2 + 0x60);
        }
        *(int *)(lVar2 + 0x58) = *(int *)(lVar2 + 0x58) + 1;
        std::unique_lock<std::mutex>::unlock(&local_60);
        if ((long)pcVar5 < (long)pcVar7) {
          do {
            if (*(long *)(lVar2 + 0x10) == 0) {
              local_50._M_dataplus._M_p =
                   (pointer)((long)pcVar5 % (long)*(int *)(lVar2 + 0x68) & 0xffffffffU |
                            (long)pcVar5 / (long)*(int *)(lVar2 + 0x68) << 0x20);
              if (*(long *)(lVar2 + 0x30) == 0) {
                uVar4 = std::__throw_bad_function_call();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                std::unique_lock<std::mutex>::~unique_lock(&local_60);
                _Unwind_Resume(uVar4);
              }
              (**(code **)(lVar2 + 0x38))(lVar2 + 0x20,&local_50);
            }
            else {
              local_50._M_dataplus._M_p = pcVar5;
              (**(code **)(lVar2 + 0x18))(lVar2,&local_50);
            }
            pcVar5 = pcVar5 + 1;
          } while (pcVar7 != pcVar5);
        }
        std::unique_lock<std::mutex>::lock(&local_60);
        iVar3 = *(int *)(lVar2 + 0x58) + -1;
        *(int *)(lVar2 + 0x58) = iVar3;
        if (iVar3 == 0 && *(long *)(lVar2 + 0x40) <= *(long *)(lVar2 + 0x50)) {
          std::condition_variable::notify_all();
        }
      }
      else {
        LOCK();
        reporterCount = reporterCount + -1;
        UNLOCK();
        if (reporterCount == 0) {
          std::condition_variable::notify_one();
        }
LAB_0012974e:
        std::condition_variable::wait((unique_lock *)workListCondition);
      }
    } while (shutdownThreads != '\x01');
  }
  formatString<char_const*,int,int>
            (&local_50,"[%s] \x1b[37;1mINFO(%d):\x1b[0m Exiting worker thread %d\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/core/concurrency.cpp"
             ,0x88,tIndex);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return;
}

Assistant:

static void workerThreadFunc(int tIndex, std::shared_ptr<Barrier> barrier) {
    LOG_INFO_FMT("Started execution in worker thread %d", tIndex);
    ThreadIndex = tIndex;

    // The main thread sets up a barrier so that it can be sure that all
    // workers have called ProfilerWorkerThreadInit() before it continues
    // (and actually starts the profiling system).
    barrier->wait();

    // Release our reference to the Barrier so that it's freed once all of
    // the threads have cleared it.
    barrier.reset();

    std::unique_lock<std::mutex> lock(workListMutex);
    while (!shutdownThreads) {
        if (reportWorkerStats) {
            if (--reporterCount == 0)
                // Once all worker threads have merged their stats, wake up
                // the main thread.
                reportDoneCondition.notify_one();
            // Now sleep again.
            workListCondition.wait(lock);
        } else if (!workList) {
            // Sleep until there are more tasks to run
            workListCondition.wait(lock);
        } else {
            // Get work from _workList_ and run loop iterations
            ParallelForLoop &loop = *workList;

            // Run a chunk of loop iterations for _loop_

            // Find the set of loop iterations to run next
            int64_t indexStart = loop.nextIndex;
            int64_t indexEnd =
                std::min(indexStart + loop.chunkSize, loop.maxIndex);

            // Update _loop_ to reflect iterations this thread will run
            loop.nextIndex = indexEnd;
            if (loop.nextIndex == loop.maxIndex) workList = loop.next;
            loop.activeWorkers++;

            // Run loop indices in _[indexStart, indexEnd)_
            lock.unlock();
            for (int64_t index = indexStart; index < indexEnd; ++index) {
                if (loop.func1D) {
                    loop.func1D(index);
                }
                // Handle other types of loops
                else {
                    ASSERT(loop.func2D);
                    loop.func2D(Point2i(index % loop.nX, index / loop.nX));
                }
            }
            lock.lock();

            // Update _loop_ to reflect completion of iterations
            loop.activeWorkers--;
            if (loop.finished()) workListCondition.notify_all();
        }
    }
    LOG_INFO_FMT("Exiting worker thread %d", tIndex);
}